

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning<true>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  value_type peVar1;
  double dVar2;
  action_score *paVar3;
  undefined1 uVar4;
  bool bVar5;
  size_type sVar6;
  reference ppeVar7;
  undefined8 uVar8;
  action_score **ppaVar9;
  size_t sVar10;
  wclass *pwVar11;
  reference ppeVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  example **example_1;
  iterator __end3_1;
  iterator __begin3_1;
  multi_ex *__range3_1;
  float prob;
  example **example;
  iterator __end3;
  iterator __begin3;
  multi_ex *__range3;
  float sum_prob;
  size_t k_3;
  size_t k_2;
  example *ec_1;
  uint32_t k_1;
  float min_score;
  action_score s;
  example *ec;
  uint32_t k;
  uint32_t predicted_K;
  bool isTest;
  uint32_t K;
  stringstream __msg;
  multi_ex ec_seq;
  float in_stack_fffffffffffffd18;
  uint32_t in_stack_fffffffffffffd1c;
  v_array<v_array<ACTION_SCORE::action_score>_> *in_stack_fffffffffffffd20;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  int plineNumber;
  action_score *paVar13;
  multi_ex *in_stack_fffffffffffffd48;
  ldf *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  ldf *in_stack_fffffffffffffd78;
  ldf *in_stack_fffffffffffffd80;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_278;
  v_array<v_array<ACTION_SCORE::action_score>_> *local_270;
  float local_264;
  reference local_260;
  example **local_258;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_250;
  v_array<v_array<ACTION_SCORE::action_score>_> *local_248;
  float local_23c;
  ulong local_238;
  ulong local_230;
  value_type local_228;
  uint in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  uint in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  value_type in_stack_fffffffffffffdf0;
  uint local_204;
  uint local_200;
  stringstream local_1d0 [16];
  stringstream local_1c0 [144];
  multi_ex *in_stack_fffffffffffffed0;
  single_learner *in_stack_fffffffffffffed8;
  ldf *in_stack_fffffffffffffee0;
  v_array<v_array<ACTION_SCORE::action_score>_> local_30;
  long local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  local_30.erase_count = (size_t)in_RDX;
  local_8 = in_RDI;
  sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar6 != 0) {
    ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)local_30.erase_count,0);
    *(uint64_t *)(local_8 + 0xf0) = ((*ppeVar7)->super_example_predict).ft_offset;
    process_labels(in_stack_fffffffffffffd78,
                   (multi_ex *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size
                      ((vector<example_*,_std::allocator<example_*>_> *)&local_30);
    if (sVar6 != 0) {
      uVar4 = ec_seq_has_label_definition((multi_ex *)in_stack_fffffffffffffd30);
      if ((bool)uVar4) {
        std::__cxx11::stringstream::stringstream(local_1d0);
        std::operator<<((ostream *)(local_1d0 + 0x10),
                        "error: label definition encountered in data block");
        uVar8 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                   plineNumber,in_stack_fffffffffffffd38);
        __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size
                        ((vector<example_*,_std::allocator<example_*>_> *)&local_30);
      bVar5 = test_ldf_sequence(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_200 = 0;
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        in_stack_fffffffffffffde4 = 3.4028235e+38;
        for (in_stack_fffffffffffffde0 = 0; in_stack_fffffffffffffde0 < (uint)sVar6;
            in_stack_fffffffffffffde0 = in_stack_fffffffffffffde0 + 1) {
          ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)&local_30,
                               (ulong)in_stack_fffffffffffffde0);
          local_228 = *ppeVar7;
          make_single_prediction
                    (in_stack_fffffffffffffd80,(single_learner *)in_stack_fffffffffffffd78,
                     (example *)CONCAT17(uVar4,in_stack_fffffffffffffd70));
          if (local_228->partial_prediction < in_stack_fffffffffffffde4) {
            in_stack_fffffffffffffde4 = local_228->partial_prediction;
            local_200 = in_stack_fffffffffffffde0;
          }
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd20);
        v_array<v_array<ACTION_SCORE::action_score>_>::clear(in_stack_fffffffffffffd20);
        for (local_204 = 0; local_204 < (uint)sVar6; local_204 = local_204 + 1) {
          ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)&local_30,
                               (ulong)local_204);
          in_stack_fffffffffffffdf0 = *ppeVar7;
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (in_stack_fffffffffffffd20,
                     (v_array<ACTION_SCORE::action_score> *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          make_single_prediction
                    (in_stack_fffffffffffffd80,(single_learner *)in_stack_fffffffffffffd78,
                     (example *)CONCAT17(uVar4,in_stack_fffffffffffffd70));
          in_stack_fffffffffffffdec = in_stack_fffffffffffffdf0->partial_prediction;
          in_stack_fffffffffffffde8 = local_204;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd20,
                     (action_score *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        }
        ppaVar9 = v_array<ACTION_SCORE::action_score>::begin
                            ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        paVar13 = *ppaVar9;
        sVar10 = v_array<ACTION_SCORE::action_score>::size
                           ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        qsort(paVar13,sVar10,8,ACTION_SCORE::score_comp);
      }
      if (!bVar5) {
        if ((*(byte *)(local_8 + 0xb8) & 1) == 0) {
          do_actual_learning_oaa
                    ((ldf *)in_stack_fffffffffffffdf0,
                     (single_learner *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                     ,(multi_ex *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        }
        else {
          do_actual_learning_wap
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        }
      }
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        for (local_238 = 0; local_238 < (sVar6 & 0xffffffff); local_238 = local_238 + 1) {
          if (local_238 == local_200) {
            ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)&local_30,
                                 local_238);
            pwVar11 = v_array<COST_SENSITIVE::wclass>::operator[]
                                ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar7)->l).simple,0);
            in_stack_fffffffffffffd1c = pwVar11->class_index;
            ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)&local_30,
                                 local_238);
            ((*ppeVar7)->pred).multiclass = in_stack_fffffffffffffd1c;
          }
          else {
            ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)&local_30,
                                 local_238);
            ((*ppeVar7)->pred).scalar = 0.0;
          }
        }
      }
      else {
        v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                  ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),0);
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd20);
        for (local_230 = 0; local_230 < (sVar6 & 0xffffffff); local_230 = local_230 + 1) {
          in_stack_fffffffffffffd30 =
               v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                         ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),
                          local_230);
          in_stack_fffffffffffffd20 = &local_30;
          ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               in_stack_fffffffffffffd20,local_230);
          peVar1 = *ppeVar7;
          paVar13 = in_stack_fffffffffffffd30->_begin;
          paVar3 = in_stack_fffffffffffffd30->_end;
          sVar10 = in_stack_fffffffffffffd30->erase_count;
          (peVar1->pred).scalars.end_array = (float *)in_stack_fffffffffffffd30->end_array;
          (peVar1->pred).scalars.erase_count = sVar10;
          (peVar1->pred).scalars._begin = (float *)paVar13;
          (peVar1->pred).scalars._end = (float *)paVar3;
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd20,0);
          v_array<ACTION_SCORE::action_score>::operator[]
                    ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0),local_230);
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd20,
                     (action_score *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        }
      }
      if ((*(byte *)(local_8 + 0xbb) & 1) != 0) {
        local_23c = 0.0;
        local_248 = &local_30;
        local_250._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::begin
                       ((vector<example_*,_std::allocator<example_*>_> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        local_258 = (example **)
                    std::vector<example_*,_std::allocator<example_*>_>::end
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)in_stack_fffffffffffffd20,
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
              bVar5) {
          local_260 = __gnu_cxx::
                      __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                      ::operator*(&local_250);
          dVar2 = std::exp((double)(ulong)(uint)(*local_260)->partial_prediction);
          in_stack_fffffffffffffd18 = SUB84(dVar2,0);
          local_264 = 1.0 / (in_stack_fffffffffffffd18 + 1.0);
          ((*local_260)->pred).scalar = local_264;
          local_23c = local_264 + local_23c;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++(&local_250);
        }
        local_270 = &local_30;
        local_278._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::begin
                       ((vector<example_*,_std::allocator<example_*>_> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        std::vector<example_*,_std::allocator<example_*>_>::end
                  ((vector<example_*,_std::allocator<example_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)in_stack_fffffffffffffd20,
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
              bVar5) {
          ppeVar12 = __gnu_cxx::
                     __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                     ::operator*(&local_278);
          ((*ppeVar12)->pred).scalar = ((*ppeVar12)->pred).scalar / local_23c;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++(&local_278);
        }
      }
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector
              ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd30);
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();

  bool isTest = test_ldf_sequence(data, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = 0;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      data.stored_preds.push_back(ec->pred.a_s);
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, ec_seq);
    else
      do_actual_learning_oaa(data, base, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    for (size_t k = 0; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = 0; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (const auto & example : ec_seq)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(example->partial_prediction));
      example->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (const auto& example : ec_seq)
    {
      example->pred.prob /= sum_prob;
    }
  }
}